

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O0

Pivot * __thiscall fizplex::Base::find_pivot(Base *this,size_t ind)

{
  bool bVar1;
  pointer in_RDX;
  vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_> *in_RSI;
  Pivot *in_RDI;
  double val_00;
  double dVar2;
  double dVar3;
  double val;
  size_t j;
  Pivot *ind_00;
  pointer local_18;
  
  ind_00 = in_RDI;
  memset(in_RDI,0,0x18);
  local_18 = in_RDX;
  do {
    if (in_RSI[2].super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>.
        _M_impl.super__Vector_impl_data._M_start <= local_18) {
      return ind_00;
    }
    std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::operator[]
              (in_RSI,(size_type)local_18);
    val_00 = SVector::get_value((SVector *)in_RSI,(size_t)ind_00);
    bVar1 = is_zero(val_00,1e-07);
    if (!bVar1) {
      if ((in_RDI->found & 1U) != 0) {
        dVar2 = find_pivot::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)&find_pivot(unsigned_long)::dist_to_one,val_00
                          );
        dVar3 = find_pivot::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)&find_pivot(unsigned_long)::dist_to_one,
                           in_RDI->value);
        if (dVar3 <= dVar2) goto LAB_001e396e;
      }
      in_RDI->found = true;
      in_RDI->index = (size_t)local_18;
      in_RDI->value = val_00;
    }
LAB_001e396e:
    local_18 = (pointer)((long)&(local_18->eta).values.
                                super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                        + 1);
  } while( true );
}

Assistant:

Base::Pivot Base::find_pivot(size_t ind) const {
  static const auto dist_to_one = [](double d) {
    return std::fabs(1 - 1.0 / std::fabs(d));
  };
  Pivot pivot{false, 0, 0};
  for (size_t j = ind; j < m; j++) { // Find etm with non-zero in ind
    auto val = etms[j].eta.get_value(ind);
    if (is_zero(val))
      continue;
    if (not pivot.found or (dist_to_one(val) < dist_to_one(pivot.value))) {
      pivot.found = true;
      pivot.index = j;
      pivot.value = val;
    }
  }
  return pivot;
}